

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KBO.hpp
# Opt level: O0

KboSpecialWeights<Kernel::FuncSigTraits> *
Kernel::KboSpecialWeights<Kernel::FuncSigTraits>::dflt
          (KboSpecialWeights<Kernel::FuncSigTraits> *__return_storage_ptr__,bool qkbo)

{
  bool qkbo_local;
  
  __return_storage_ptr__->_variableWeight = 1;
  __return_storage_ptr__->_numInt = 1;
  __return_storage_ptr__->_numRat = 1;
  __return_storage_ptr__->_numReal = 1;
  __return_storage_ptr__->_qkbo = qkbo;
  return __return_storage_ptr__;
}

Assistant:

inline static KboSpecialWeights dflt(bool qkbo) 
  { 
    return { 
      ._variableWeight = 1, 
      ._numInt  = 1,
      ._numRat  = 1,
      ._numReal = 1,
      ._qkbo = qkbo,
    }; 
  }